

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future_std.h
# Opt level: O0

unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
__thiscall
prometheus::detail::
make_unique<prometheus::BasicAuthHandler,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::__cxx11::string_const&>
          (detail *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  BasicAuthHandler *this_00;
  string local_60;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *args_local;
  
  local_20 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)this;
  this_00 = (BasicAuthHandler *)operator_new(0x48);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_40,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)args_local_1);
  std::__cxx11::string::string((string *)&local_60,(string *)local_20);
  BasicAuthHandler::BasicAuthHandler(this_00,&local_40,&local_60);
  std::unique_ptr<prometheus::BasicAuthHandler,std::default_delete<prometheus::BasicAuthHandler>>::
  unique_ptr<std::default_delete<prometheus::BasicAuthHandler>,void>
            ((unique_ptr<prometheus::BasicAuthHandler,std::default_delete<prometheus::BasicAuthHandler>>
              *)this,this_00);
  std::__cxx11::string::~string((string *)&local_60);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  return (__uniq_ptr_data<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>,_true,_true>
          )(__uniq_ptr_data<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}